

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::SetExplicitFreeBitOnSmallBlock<MediumAllocationBlockAttributes>
          (Recycler *this,HeapBlock *heapBlock,size_t sizeCat,void *buffer,ObjectInfoBits attributes
          )

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 *puVar4;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *smallBlock;
  ObjectInfoBits attributes_local;
  void *buffer_local;
  size_t sizeCat_local;
  HeapBlock *heapBlock_local;
  Recycler *this_local;
  
  bVar2 = HeapBlock::IsLargeHeapBlock(heapBlock);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x46f,"(!heapBlock->IsLargeHeapBlock())","!heapBlock->IsLargeHeapBlock()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  iVar3 = (*heapBlock->_vptr_HeapBlock[9])(heapBlock,buffer);
  if (CONCAT44(extraout_var,iVar3) != sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x470,"(heapBlock->GetObjectSize(buffer) == sizeCat)",
                       "heapBlock->GetObjectSize(buffer) == sizeCat");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((attributes & LeafBit) == LeafBit) {
    bVar2 = HeapBlock::IsLeafBlock(heapBlock);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x474,"(smallBlock->IsLeafBlock())","smallBlock->IsLeafBlock()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  else {
    bVar2 = HeapBlock::IsAnyNormalBlock(heapBlock);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x478,"(smallBlock->IsAnyNormalBlock())","smallBlock->IsAnyNormalBlock()")
      ;
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  SmallHeapBlockT<MediumAllocationBlockAttributes>::SetExplicitFreeBitForObject
            ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock,buffer);
  return;
}

Assistant:

void Recycler::SetExplicitFreeBitOnSmallBlock(HeapBlock* heapBlock, size_t sizeCat, void* buffer, ObjectInfoBits attributes)
{
    Assert(!heapBlock->IsLargeHeapBlock());
    Assert(heapBlock->GetObjectSize(buffer) == sizeCat);
    SmallHeapBlockT<TBlockAttributes>* smallBlock = (SmallHeapBlockT<TBlockAttributes>*)heapBlock;
    if ((attributes & ObjectInfoBits::LeafBit) == LeafBit)
    {
        Assert(smallBlock->IsLeafBlock());
    }
    else
    {
        Assert(smallBlock->IsAnyNormalBlock());
    }


#ifdef RECYCLER_MEMORY_VERIFY
    smallBlock->SetExplicitFreeBitForObject(buffer);
#endif
}